

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassFieldToObject
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  Descriptor *this_00;
  FieldDescriptor *pFVar3;
  GeneratorOptions *options_00;
  long *plVar4;
  undefined1 *descriptor;
  FieldDescriptor FVar5;
  Generator *this_01;
  Printer *this_02;
  BytesMode in_R8D;
  undefined1 in_R9B;
  string value_to_object;
  string local_90;
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined1 local_50 [32];
  
  (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
            (&local_90,(_anonymous_namespace_ *)field,(GeneratorOptions *)printer,field);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"$fieldname$: ",(char (*) [10])"fieldname",&local_90);
  paVar1 = &local_90.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_90._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_70._0_8_ = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_90,
               (FieldDescriptor **)local_70);
  }
  if ((*(int *)(field + 0x38) == 0xb) &&
     (bVar2 = FieldDescriptor::is_map_message_type(field), bVar2)) {
    this_00 = FieldDescriptor::message_type(field);
    pFVar3 = Descriptor::FindFieldByNumber(this_00,2);
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_90._M_dataplus._M_p = (pointer)paVar1;
    if (*(once_flag **)(pFVar3 + 0x30) != (once_flag *)0x0) {
      local_70._0_8_ = FieldDescriptor::TypeOnceInit;
      local_50._0_8_ = pFVar3;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar3 + 0x30),(_func_void_FieldDescriptor_ptr **)local_70,
                 (FieldDescriptor **)local_50);
    }
    descriptor = FieldDescriptor::kTypeToCppTypeMap;
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(pFVar3 + 0x38) * 4) == 10) {
      options_00 = (GeneratorOptions *)FieldDescriptor::message_type(pFVar3);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                ((string *)local_50,(_anonymous_namespace_ *)options,options_00,
                 (Descriptor *)descriptor);
      plVar4 = (long *)std::__cxx11::string::append(local_50);
      pFVar3 = (FieldDescriptor *)(plVar4 + 2);
      if ((FieldDescriptor *)*plVar4 == pFVar3) {
        local_60._M_allocated_capacity = *(undefined8 *)pFVar3;
        local_60._8_8_ = plVar4[3];
        local_70._0_8_ = (FieldDescriptor *)(local_70 + 0x10);
      }
      else {
        local_60._M_allocated_capacity = *(undefined8 *)pFVar3;
        local_70._0_8_ = (FieldDescriptor *)*plVar4;
      }
      local_70._8_8_ = plVar4[1];
      *plVar4 = (long)pFVar3;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_90,(string *)local_70);
      if ((FieldDescriptor *)local_70._0_8_ != (FieldDescriptor *)(local_70 + 0x10)) {
        operator_delete((void *)local_70._0_8_);
      }
      if ((FieldDescriptor *)local_50._0_8_ != (FieldDescriptor *)(local_50 + 0x10)) {
        operator_delete((void *)local_50._0_8_);
      }
    }
    else {
      in_R8D = 9;
      std::__cxx11::string::_M_replace
                ((ulong)&local_90,0,(char *)local_90._M_string_length,0x39ef80);
    }
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              ((string *)local_70,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,in_R8D,(bool)in_R9B);
    io::Printer::Print<char[5],std::__cxx11::string,char[14],std::__cxx11::string>
              (printer,"(f = msg.get$name$()) ? f.toObject(includeInstance, $valuetoobject$) : []",
               (char (*) [5])0x3958cc,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
               (char (*) [14])"valuetoobject",&local_90);
  }
  else {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_90._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_70._0_8_ = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_90,
                 (FieldDescriptor **)local_70);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 10) {
      this_01 = *(Generator **)(field + 0x30);
      if (this_01 != (Generator *)0x0) {
        local_90._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
        local_70._0_8_ = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  ((once_flag *)this_01,(_func_void_FieldDescriptor_ptr **)&local_90,
                   (FieldDescriptor **)local_70);
      }
      if (*(int *)(field + 0x38) != 0xc) {
        FVar5 = field[0x40];
        if (*(int *)(*(long *)(field + 0x28) + 0x3c) == 3) {
          FVar5 = (FieldDescriptor)((byte)FVar5 | *(int *)(field + 0x3c) != 3);
        }
        if (((byte)FVar5 & 1) != 0) {
          GenerateFieldValueExpression(this_01,printer,"msg",field,true);
          return;
        }
        this_02 = printer;
        io::Printer::Print<>(printer,"(f = ");
        GenerateFieldValueExpression
                  ((Generator *)this_02,printer,"msg",field,(bool)((byte)FVar5 & 1));
        io::Printer::Print<>(printer,") == null ? undefined : f");
        return;
      }
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                (&local_90,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x1,
                 (FieldDescriptor *)0x0,in_R8D,(bool)in_R9B);
      io::Printer::Print<char[7],std::__cxx11::string>
                (printer,"msg.get$getter$()",(char (*) [7])"getter",&local_90);
      goto LAB_00247f78;
    }
    if (*(int *)(field + 0x3c) == 3) {
      pFVar3 = (FieldDescriptor *)0x0;
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                (&local_90,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
                 (FieldDescriptor *)0x0,in_R8D,(bool)in_R9B);
      (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                ((string *)local_70,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                 pFVar3);
      io::Printer::Print<char[7],std::__cxx11::string,char[5],std::__cxx11::string>
                (printer,
                 "jspb.Message.toObjectList(msg.get$getter$(),\n    $type$.toObject, includeInstance)"
                 ,(char (*) [7])"getter",&local_90,(char (*) [5])0x3eb793,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    }
    else {
      pFVar3 = (FieldDescriptor *)0x0;
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                (&local_90,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
                 (FieldDescriptor *)0x0,in_R8D,(bool)in_R9B);
      (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                ((string *)local_70,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                 pFVar3);
      io::Printer::Print<char[7],std::__cxx11::string,char[5],std::__cxx11::string>
                (printer,"(f = msg.get$getter$()) && $type$.toObject(includeInstance, f)",
                 (char (*) [7])"getter",&local_90,(char (*) [5])0x3eb793,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    }
  }
  if ((FieldDescriptor *)local_70._0_8_ != (FieldDescriptor *)(local_70 + 0x10)) {
    operator_delete((void *)local_70._0_8_);
  }
LAB_00247f78:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Generator::GenerateClassFieldToObject(const GeneratorOptions& options,
                                           io::Printer* printer,
                                           const FieldDescriptor* field) const {
  printer->Print("$fieldname$: ", "fieldname",
                 JSObjectFieldName(options, field));

  if (field->is_map()) {
    const FieldDescriptor* value_field = MapFieldValue(field);
    // If the map values are of a message type, we must provide their static
    // toObject() method; otherwise we pass undefined for that argument.
    std::string value_to_object;
    if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      value_to_object =
          GetMessagePath(options, value_field->message_type()) + ".toObject";
    } else {
      value_to_object = "undefined";
    }
    printer->Print(
        "(f = msg.get$name$()) ? f.toObject(includeInstance, $valuetoobject$) "
        ": []",
        "name", JSGetterName(options, field), "valuetoobject", value_to_object);
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    // Message field.
    if (field->is_repeated()) {
      {
        printer->Print(
            "jspb.Message.toObjectList(msg.get$getter$(),\n"
            "    $type$.toObject, includeInstance)",
            "getter", JSGetterName(options, field), "type",
            SubmessageTypeRef(options, field));
      }
    } else {
      printer->Print(
          "(f = msg.get$getter$()) && "
          "$type$.toObject(includeInstance, f)",
          "getter", JSGetterName(options, field), "type",
          SubmessageTypeRef(options, field));
    }
  } else if (field->type() == FieldDescriptor::TYPE_BYTES) {
    // For bytes fields we want to always return the B64 data.
    printer->Print("msg.get$getter$()", "getter",
                   JSGetterName(options, field, BYTES_B64));
  } else {
    bool use_default = field->has_default_value();

    if (field->file()->syntax() == FileDescriptor::SYNTAX_PROTO3 &&
        // Repeated fields get initialized to their default in the constructor
        // (why?), so we emit a plain getField() call for them.
        !field->is_repeated()) {
      // Proto3 puts all defaults (including implicit defaults) in toObject().
      // But for proto2 we leave the existing semantics unchanged: unset fields
      // without default are unset.
      use_default = true;
    }

    // We don't implement this by calling the accessors, because the semantics
    // of the accessors are changing independently of the toObject() semantics.
    // We are migrating the accessors to return defaults instead of null, but
    // it may take longer to migrate toObject (or we might not want to do it at
    // all).  So we want to generate independent code.
    // The accessor for unset optional values without default should return
    // null. Those are converted to undefined in the generated object.
    if (!use_default) {
      printer->Print("(f = ");
    }
    GenerateFieldValueExpression(printer, "msg", field, use_default);
    if (!use_default) {
      printer->Print(") == null ? undefined : f");
    }
  }
}